

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O3

void UYVYToYRow_C(uint8_t *src_uyvy,uint8_t *dst_y,int width)

{
  uint8_t *puVar1;
  ulong uVar2;
  
  puVar1 = src_uyvy;
  if (1 < width) {
    uVar2 = 0;
    do {
      dst_y[uVar2] = src_uyvy[uVar2 * 2 + 1];
      dst_y[uVar2 + 1] = src_uyvy[uVar2 * 2 + 3];
      puVar1 = puVar1 + 4;
      uVar2 = uVar2 + 2;
    } while (uVar2 < ((long)width - 1U & 0xffffffff));
  }
  if ((width & 1U) != 0) {
    dst_y[(long)width - 1U] = puVar1[1];
  }
  return;
}

Assistant:

void UYVYToYRow_C(const uint8_t* src_uyvy, uint8_t* dst_y, int width) {
  // Output a row of Y values.
  int x;
  for (x = 0; x < width - 1; x += 2) {
    dst_y[x] = src_uyvy[1];
    dst_y[x + 1] = src_uyvy[3];
    src_uyvy += 4;
  }
  if (width & 1) {
    dst_y[width - 1] = src_uyvy[1];
  }
}